

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_crypto_xar(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  TCGv_i64 ret;
  bool bVar2;
  TCGTemp *a2;
  TCGTemp *a3;
  TCGTemp *pTVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uintptr_t o_3;
  long *plVar7;
  int iVar8;
  uintptr_t o;
  ulong uVar9;
  uintptr_t o_4;
  long local_40;
  long local_38;
  
  if ((s->isar->id_aa64isar0 & 0xf00000000) == 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked != true) {
    s_00 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    uVar9 = 0;
    a2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    a3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    lVar4 = (long)pTVar3 - (long)s_00;
    plVar7 = &local_38;
    local_38 = lVar4;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    lVar5 = (long)pTVar3 - (long)s_00;
    bVar2 = true;
    local_40 = lVar5;
    do {
      bVar6 = bVar2;
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + ((long)a2 - (long)s_00),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          uVar9 | (insn * 8 & 0x1f00) + 0xc10);
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(long)pTVar1 + ((long)a3 - (long)s_00),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          uVar9 | (insn >> 8 & 0x1f00) + 0xc10);
      ret = (TCGv_i64)*plVar7;
      tcg_gen_op3_aarch64(s_00,INDEX_op_xor_i64,(TCGArg)(ret + (long)&s_00->pool_cur),(TCGArg)a2,
                          (TCGArg)a3);
      tcg_gen_rotri_i64_aarch64(s_00,ret,ret,insn >> 10 & 0x3f);
      uVar9 = 8;
      plVar7 = &local_40;
      bVar2 = false;
    } while (bVar6);
    pTVar1 = s->uc->tcg_ctx;
    iVar8 = (insn & 0x1f) * 0x100;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)pTVar1 + lVar4,
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc10));
    pTVar1 = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)pTVar1 + lVar5,
                        (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)(iVar8 + 0xc18));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a2 - (long)s_00) + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(((long)a3 - (long)s_00) + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar4 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(lVar5 + (long)s_00));
    return;
  }
  __assert_fail("!s->fp_access_checked",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x487,"_Bool fp_access_check(DisasContext *)");
}

Assistant:

static void disas_crypto_xar(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rm = extract32(insn, 16, 5);
    int imm6 = extract32(insn, 10, 6);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
    int pass;

    if (!dc_isar_feature(aa64_sha3, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_op1 = tcg_temp_new_i64(tcg_ctx);
    tcg_op2 = tcg_temp_new_i64(tcg_ctx);
    tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
    tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

    for (pass = 0; pass < 2; pass++) {
        read_vec_element(s, tcg_op1, rn, pass, MO_64);
        read_vec_element(s, tcg_op2, rm, pass, MO_64);

        tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
        tcg_gen_rotri_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], imm6);
    }
    write_vec_element(s, tcg_res[0], rd, 0, MO_64);
    write_vec_element(s, tcg_res[1], rd, 1, MO_64);

    tcg_temp_free_i64(tcg_ctx, tcg_op1);
    tcg_temp_free_i64(tcg_ctx, tcg_op2);
    tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
    tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
}